

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  OptimalControlProblemPimpl *pOVar1;
  char cVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  size_t numberOfRows;
  size_t numberOfColumns;
  _Self __tmp;
  ostringstream errorMsg;
  long *local_1c8;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  p_Var3 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header) {
    do {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x50))();
      *(char *)((long)&p_Var3[0x13]._M_parent + 1) = cVar2;
      if (cVar2 == '\0') goto LAB_0014777c;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header
            );
    if (cVar2 == '\0') {
LAB_0014777c:
      if ((this->m_pimpl->dynamicalSystem).
          super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                   ,0xa4);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","costsSecondPartialDerivativeWRTControlSparsity",
                   (char *)local_1c8);
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      SparsityStructure::clear(&this->m_pimpl->costsControlHessianSparsity);
      pOVar1 = this->m_pimpl;
      numberOfRows = DynamicalSystem::controlSpaceSize
                               ((pOVar1->dynamicalSystem).
                                super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      numberOfColumns =
           DynamicalSystem::controlSpaceSize
                     ((this->m_pimpl->dynamicalSystem).
                      super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
      SparsityStructure::addDenseBlock
                (&pOVar1->costsControlHessianSparsity,0,0,numberOfRows,numberOfColumns);
      goto LAB_001477c8;
    }
  }
  SparsityStructure::clear(&this->m_pimpl->costsControlHessianSparsity);
  pOVar1 = this->m_pimpl;
  for (p_Var4 = (pOVar1->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(pOVar1->costs)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    SparsityStructure::merge
              (&this->m_pimpl->costsControlHessianSparsity,
               (SparsityStructure *)&p_Var4[0xc]._M_right);
  }
LAB_001477c8:
  pOVar1 = this->m_pimpl;
  if (&pOVar1->costsControlHessianSparsity != controlSparsity) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)controlSparsity,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&pOVar1->costsControlHessianSparsity);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&controlSparsity->m_nonZeroElementRows,
             &(pOVar1->costsControlHessianSparsity).m_nonZeroElementRows);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&controlSparsity->m_nonZeroElementColumns,
             &(pOVar1->costsControlHessianSparsity).m_nonZeroElementColumns);
  return true;
}

Assistant:

bool OptimalControlProblem::costsSecondPartialDerivativeWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            bool allHaveSparsity = true;

            auto cost = m_pimpl->costs.begin();

            while (allHaveSparsity && cost != m_pimpl->costs.end()) {
                cost->second.hasControlHessianSparsity =
                    cost->second.cost->costSecondPartialDerivativeWRTControlSparsity(cost->second.controlHessianSparsity);
                allHaveSparsity &= cost->second.hasControlHessianSparsity;
                cost++;
            }

            if (allHaveSparsity) {
                m_pimpl->costsControlHessianSparsity.clear();

                for (auto& costPtr : m_pimpl->costs) {
                    m_pimpl->costsControlHessianSparsity.merge(costPtr.second.controlHessianSparsity);
                }

            } else {
                if (m_pimpl->dynamicalSystem) {
                    m_pimpl->costsControlHessianSparsity.clear();
                    m_pimpl->costsControlHessianSparsity.addDenseBlock(0, 0, m_pimpl->dynamicalSystem->controlSpaceSize(), m_pimpl->dynamicalSystem->controlSpaceSize());
                } else {
                    std::ostringstream errorMsg;
                    errorMsg << "Not all costs have the hessian sparsity defined and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                    reportError("OptimalControlProblem", "costsSecondPartialDerivativeWRTControlSparsity", errorMsg.str().c_str());
                    return false;
                }
            }

            controlSparsity = m_pimpl->costsControlHessianSparsity;
            return true;
        }